

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_srtp_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  SSL *ssl_00;
  int iVar1;
  undefined1 local_88 [8];
  CBB profile_ids;
  CBB contents;
  SSL *ssl;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if (ssl_00->s3->srtp_profile == (SRTP_PROTECTION_PROFILE *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    iVar1 = SSL_is_dtls(ssl_00);
    if (iVar1 == 0) {
      __assert_fail("SSL_is_dtls(ssl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x6e6,"bool bssl::ext_srtp_add_serverhello(SSL_HANDSHAKE *, CBB *)");
    }
    iVar1 = CBB_add_u16(out,0xe);
    if ((((iVar1 != 0) &&
         (iVar1 = CBB_add_u16_length_prefixed(out,(CBB *)((long)&profile_ids.u + 0x18)), iVar1 != 0)
         ) && (iVar1 = CBB_add_u16_length_prefixed
                                 ((CBB *)((long)&profile_ids.u + 0x18),(CBB *)local_88), iVar1 != 0)
        ) && (((iVar1 = CBB_add_u16((CBB *)local_88,(uint16_t)ssl_00->s3->srtp_profile->id),
               iVar1 != 0 &&
               (iVar1 = CBB_add_u8((CBB *)((long)&profile_ids.u + 0x18),'\0'), iVar1 != 0)) &&
              (iVar1 = CBB_flush(out), iVar1 != 0)))) {
      return true;
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_srtp_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  if (ssl->s3->srtp_profile == NULL) {
    return true;
  }

  assert(SSL_is_dtls(ssl));
  CBB contents, profile_ids;
  if (!CBB_add_u16(out, TLSEXT_TYPE_srtp) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &profile_ids) ||
      !CBB_add_u16(&profile_ids, ssl->s3->srtp_profile->id) ||
      !CBB_add_u8(&contents, 0 /* empty MKI */) || !CBB_flush(out)) {
    return false;
  }

  return true;
}